

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void BlendPlaneRow_AVX2(uint8_t *src0,uint8_t *src1,uint8_t *alpha,uint8_t *dst,int width)

{
  undefined1 auVar1 [32];
  bool bVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int width_local;
  
  auVar11 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar11 = vpsllw_avx2(auVar11,8);
  auVar12._8_4_ = 0x80808080;
  auVar12._0_8_ = 0x8080808080808080;
  auVar12._12_4_ = 0x80808080;
  auVar12._16_4_ = 0x80808080;
  auVar12._20_4_ = 0x80808080;
  auVar12._24_4_ = 0x80808080;
  auVar12._28_4_ = 0x80808080;
  auVar13._8_4_ = 0x807f807f;
  auVar13._0_8_ = 0x807f807f807f807f;
  auVar13._12_4_ = 0x807f807f;
  auVar13._16_4_ = 0x807f807f;
  auVar13._20_4_ = 0x807f807f;
  auVar13._24_4_ = 0x807f807f;
  auVar13._28_4_ = 0x807f807f;
  lVar7 = (long)src0 - (long)alpha;
  lVar6 = (long)src1 - (long)alpha;
  lVar5 = (long)dst - (long)alpha;
  do {
    auVar9 = *(undefined1 (*) [32])alpha;
    auVar10 = vpunpckhbw_avx2(auVar9,auVar9);
    auVar4 = vpunpcklbw_avx2(auVar9,auVar9);
    auVar9 = *(undefined1 (*) [32])(lVar7 + (long)alpha);
    auVar1 = *(undefined1 (*) [32])(lVar6 + (long)alpha);
    auVar3 = vpunpckhbw_avx2(auVar9,auVar1);
    auVar1 = vpunpcklbw_avx2(auVar9,auVar1);
    auVar9 = vpsubb_avx2(auVar3,auVar12);
    auVar1 = vpsubb_avx2(auVar1,auVar12);
    auVar9 = vpmaddubsw_avx2(auVar10 ^ auVar11,auVar9);
    auVar1 = vpmaddubsw_avx2(auVar4 ^ auVar11,auVar1);
    auVar9 = vpaddw_avx2(auVar9,auVar13);
    auVar1 = vpaddw_avx2(auVar1,auVar13);
    auVar10 = vpsrlw_avx2(auVar9,8);
    auVar9 = vpsrlw_avx2(auVar1,8);
    auVar9 = vpackuswb_avx2(auVar9,auVar10);
    *(undefined1 (*) [32])(lVar5 + (long)alpha) = auVar9;
    alpha = (uint8_t *)((long)alpha + 0x20);
    iVar8 = width + -0x20;
    bVar2 = 0x1f < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar2);
  return;
}

Assistant:

void BlendPlaneRow_AVX2(const uint8_t* src0,
                        const uint8_t* src1,
                        const uint8_t* alpha,
                        uint8_t* dst,
                        int width) {
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsllw      $0x8,%%ymm5,%%ymm5            \n"
      "mov         $0x80808080,%%eax             \n"
      "vmovd       %%eax,%%xmm6                  \n"
      "vbroadcastss %%xmm6,%%ymm6                \n"
      "mov         $0x807f807f,%%eax             \n"
      "vmovd       %%eax,%%xmm7                  \n"
      "vbroadcastss %%xmm7,%%ymm7                \n"
      "sub         %2,%0                         \n"
      "sub         %2,%1                         \n"
      "sub         %2,%3                         \n"

      // 32 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%2),%%ymm0                   \n"
      "vpunpckhbw  %%ymm0,%%ymm0,%%ymm3          \n"
      "vpunpcklbw  %%ymm0,%%ymm0,%%ymm0          \n"
      "vpxor       %%ymm5,%%ymm3,%%ymm3          \n"
      "vpxor       %%ymm5,%%ymm0,%%ymm0          \n"
      "vmovdqu     (%0,%2,1),%%ymm1              \n"
      "vmovdqu     (%1,%2,1),%%ymm2              \n"
      "vpunpckhbw  %%ymm2,%%ymm1,%%ymm4          \n"
      "vpunpcklbw  %%ymm2,%%ymm1,%%ymm1          \n"
      "vpsubb      %%ymm6,%%ymm4,%%ymm4          \n"
      "vpsubb      %%ymm6,%%ymm1,%%ymm1          \n"
      "vpmaddubsw  %%ymm4,%%ymm3,%%ymm3          \n"
      "vpmaddubsw  %%ymm1,%%ymm0,%%ymm0          \n"
      "vpaddw      %%ymm7,%%ymm3,%%ymm3          \n"
      "vpaddw      %%ymm7,%%ymm0,%%ymm0          \n"
      "vpsrlw      $0x8,%%ymm3,%%ymm3            \n"
      "vpsrlw      $0x8,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm3,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,(%3,%2,1)              \n"
      "lea         0x20(%2),%2                   \n"
      "sub         $0x20,%4                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src0),   // %0
        "+r"(src1),   // %1
        "+r"(alpha),  // %2
        "+r"(dst),    // %3
        "+rm"(width)  // %4
        ::"memory",
        "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}